

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O3

bool __thiscall FNodeBuilder::GetPolyExtents(FNodeBuilder *this,int polynum,fixed_t *bbox)

{
  int iVar1;
  int iVar2;
  line_t *plVar3;
  FPrivVert *pFVar4;
  uint uVar5;
  ulong uVar6;
  FPrivVert *pFVar7;
  FPrivSeg *pFVar8;
  bool bVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  
  bbox[0] = -0x80000000;
  bbox[1] = 0x7fffffff;
  bbox[2] = 0x7fffffff;
  bbox[3] = -0x80000000;
  uVar11 = (this->Segs).Count;
  uVar6 = (ulong)uVar11;
  if (uVar6 != 0) {
    pFVar8 = (this->Segs).Array;
    plVar3 = this->Level->Lines;
    lVar10 = 0;
    do {
      iVar1 = *(int *)((long)&pFVar8->linedef + lVar10);
      if ((plVar3[iVar1].special == 1) && (plVar3[iVar1].args[0] == polynum)) {
        uVar11 = *(uint *)((long)&pFVar8->v1 + lVar10);
        pFVar7 = (this->Vertices).Array;
        iVar1 = pFVar7[uVar11].super_FSimpleVert.x;
        iVar2 = pFVar7[uVar11].super_FSimpleVert.y;
        AddSegToBBox(this,bbox,(FPrivSeg *)((long)&pFVar8->v1 + lVar10));
        pFVar8 = (this->Segs).Array;
        pFVar7 = (this->Vertices).Array;
        uVar11 = *(uint *)((long)&pFVar8->v2 + lVar10);
        uVar5 = pFVar7[uVar11].segs;
        if (uVar5 == 0xffffffff) {
          return true;
        }
        pFVar7 = pFVar7 + uVar11;
        uVar11 = 1;
        do {
          if (((pFVar7->super_FSimpleVert).x ==
               SUB84((double)iVar1 * 1.52587890625e-05 + 103079215104.0,0)) &&
             ((pFVar7->super_FSimpleVert).y ==
              SUB84((double)iVar2 * 1.52587890625e-05 + 103079215104.0,0))) {
            return true;
          }
          if ((this->Segs).Count <= uVar11) {
            return true;
          }
          AddSegToBBox(this,bbox,pFVar8 + uVar5);
          pFVar8 = (this->Segs).Array;
          pFVar4 = (this->Vertices).Array;
          pFVar7 = pFVar4 + (uint)pFVar8[uVar5].v2;
          uVar5 = pFVar4[(uint)pFVar8[uVar5].v2].segs;
          uVar11 = uVar11 + 1;
        } while (uVar5 != 0xffffffff);
        return true;
      }
      lVar10 = lVar10 + 0x48;
    } while (uVar6 * 0x48 != lVar10);
    if (uVar11 != 0) {
      lVar10 = 0;
      uVar12 = 0;
      bVar9 = false;
      do {
        pFVar8 = (this->Segs).Array;
        plVar3 = this->Level->Lines;
        iVar1 = *(int *)((long)&pFVar8->linedef + lVar10);
        if ((plVar3[iVar1].special == 5) && (plVar3[iVar1].args[0] == polynum)) {
          AddSegToBBox(this,bbox,(FPrivSeg *)((long)&pFVar8->v1 + lVar10));
          uVar6 = (ulong)(this->Segs).Count;
          bVar9 = true;
        }
        uVar12 = uVar12 + 1;
        lVar10 = lVar10 + 0x48;
      } while (uVar12 < uVar6);
      return bVar9;
    }
  }
  return false;
}

Assistant:

bool FNodeBuilder::GetPolyExtents (int polynum, fixed_t bbox[4])
{
	unsigned int i;

	bbox[BOXLEFT] = bbox[BOXBOTTOM] = FIXED_MAX;
	bbox[BOXRIGHT] = bbox[BOXTOP] = FIXED_MIN;

	// Try to find a polyobj marked with a start line
	for (i = 0; i < Segs.Size(); ++i)
	{
		if (Level.Lines[Segs[i].linedef].special == PO_LINE_START &&
			Level.Lines[Segs[i].linedef].args[0] == polynum)
		{
			break;
		}
	}

	if (i < Segs.Size())
	{
		vertex_t start;
		unsigned int vert;
		unsigned int count = 0;

		vert = Segs[i].v1;

		start.set(Vertices[vert].x, Vertices[vert].y);

		do
		{
			AddSegToBBox (bbox, &Segs[i]);
			vert = Segs[i].v2;
			i = Vertices[vert].segs;
			count++;	// to prevent endless loops. Stop when this reaches the number of segs.
		} while (i != DWORD_MAX && (Vertices[vert].x != start.fixX() || Vertices[vert].y != start.fixY()) && count < Segs.Size());

		return true;
	}

	// Try to find a polyobj marked with explicit lines
	bool found = false;

	for (i = 0; i < Segs.Size(); ++i)
	{
		if (Level.Lines[Segs[i].linedef].special == PO_LINE_EXPLICIT &&
			Level.Lines[Segs[i].linedef].args[0] == polynum)
		{
			AddSegToBBox (bbox, &Segs[i]);
			found = true;
		}
	}
	return found;
}